

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bbdpre.c
# Opt level: O0

int CVBBDPrecReInitB(void *cvode_mem,int which,sunindextype mudqB,sunindextype mldqB,
                    sunrealtype dqrelyB)

{
  int in_ESI;
  CVodeMem in_RDI;
  int flag;
  void *cvodeB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeBMemRec *local_48;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x351,"CVBBDPrecReInitB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x35a,"CVBBDPrecReInitB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Illegal attempt to call before calling CVodeAdjInit.");
    local_4 = -0x65;
  }
  else if (in_ESI < in_RDI->cv_adj_mem->ca_nbckpbs) {
    for (local_48 = in_RDI->cv_adj_mem->cvB_mem;
        (local_48 != (CVodeBMemRec *)0x0 && (in_ESI != local_48->cv_index));
        local_48 = local_48->cv_next) {
    }
    local_4 = CVBBDPrecReInit((void *)dqrelyB,(sunindextype)cv_mem,(sunindextype)ca_mem,
                              (sunrealtype)cvB_mem);
  }
  else {
    cvProcessError(in_RDI,-3,0x363,"CVBBDPrecReInitB",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Illegal value for the which parameter.");
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int CVBBDPrecReInitB(void* cvode_mem, int which, sunindextype mudqB,
                     sunindextype mldqB, sunrealtype dqrelyB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CVLS_NO_ADJ, __LINE__, __func__, __FILE__,
                   MSGBBD_NO_ADJ);
    return (CVLS_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGBBD_BAD_WHICH);
    return (CVLS_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    /* advance */
    cvB_mem = cvB_mem->cv_next;
  }
  /* cv_mem corresponding to 'which' backward problem. */
  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  /* ReInitialize the BBD preconditioner for this backward problem. */
  flag = CVBBDPrecReInit(cvodeB_mem, mudqB, mldqB, dqrelyB);
  return (flag);
}